

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O2

void __thiscall
mp::SPAdapter::GetVarStages<mp::BasicSuffix<int>>(SPAdapter *this,BasicSuffix<int> stage_suffix)

{
  uint uVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = (ulong)((long)(this->problem_->super_Problem).vars_.
                        super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->problem_->super_Problem).vars_.
                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    piVar2 = (this->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar2[uVar5] == 0) {
      uVar1 = *(uint *)(*(long *)((long)stage_suffix.super_SuffixBase.impl_ + 0x18) + uVar5 * 4);
      if ((int)uVar1 < 2) {
        uVar1 = 1;
      }
      piVar2[uVar5] = uVar1 - 1;
      piVar2 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2) <
          (int)uVar1) {
        std::vector<int,_std::allocator<int>_>::resize(&this->num_stage_vars_,(ulong)uVar1);
        piVar2 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      piVar2[uVar1 - 1] = piVar2[uVar1 - 1] + 1;
    }
  }
  return;
}

Assistant:

void SPAdapter::GetVarStages(Suffix stage_suffix) {
  // Count the number of variables in each stage and temporarily store variable
  // stages in var_orig2core_.
  for (int i = 0, n = problem_.num_vars(); i < n; ++i) {
    if (var_orig2core_[i])
      continue;  // Skip random variables.
    int stage = std::max(stage_suffix.value(i) - 1, 0);
    var_orig2core_[i] = stage;
    if (stage >= static_cast<int>(num_stage_vars_.size()))
      num_stage_vars_.resize(stage + 1);
    ++num_stage_vars_[stage];
  }
}